

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,BlockStmt *node)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  pointer pSVar3;
  unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *statement;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
  *__range1;
  BlockStmt *node_local;
  PrettyPrinter *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"{");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::
           vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
           ::begin(&node->m_statements);
  statement = (unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *)
              std::
              vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
              ::end(&node->m_statements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_*,_std::vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>_>
                                *)&statement);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_*,_std::vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>_>
              ::operator*(&__end1);
    std::operator<<((ostream *)&std::cout,"    ");
    pSVar3 = std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>::operator->(this_00);
    (*pSVar3->_vptr_Stmt[2])(pSVar3,this);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_*,_std::vector<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>_>
    ::operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"};");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrettyPrinter::visit(AST::BlockStmt *node) {
    std::cout << "{" << std::endl;
    for (auto& statement : node->m_statements) {
        std::cout << "    ";
        statement->accept(this);
    }
    std::cout << "};" << std::endl;
}